

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_int_scan.cpp
# Opt level: O2

void Omega_h::fill_right(Write<int> *a)

{
  Alloc *pAVar1;
  void *pvVar2;
  ulong uVar3;
  allocator local_92;
  ScopedTimer omega_h_scoped_function_timer;
  identity<int> transform;
  undefined7 uStack_8f;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_int_scan.cpp"
             ,&local_92);
  std::operator+(&local_50,&local_30,":");
  std::__cxx11::to_string(&local_70,0x1a);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&transform,
                 &local_50,&local_70);
  begin_code("fill_right",(char *)CONCAT71(uStack_8f,transform));
  std::__cxx11::string::~string((string *)&transform);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  pAVar1 = (a->shared_alloc_).alloc;
  pvVar2 = (a->shared_alloc_).direct_ptr;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  transform = (identity<int>)0x0;
  transform_inclusive_scan<int*,int*,Omega_h::maximum<int>,Omega_h::identity<int>>
            (pvVar2,(void *)((long)pvVar2 + (long)(int)(uVar3 >> 2) * 4),pvVar2);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return;
}

Assistant:

void fill_right(Write<LO> a) {
  OMEGA_H_TIME_FUNCTION;
  auto const first = a.begin();
  auto const last = a.end();
  auto const result = a.begin();
  auto const op = maximum<LO>();
  auto transform = identity<LO>();
  transform_inclusive_scan(first, last, result, op, std::move(transform));
}